

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O0

Index __thiscall
BayesianGameCollaborativeGraphical::JointToGroupTypeIndex
          (BayesianGameCollaborativeGraphical *this,Index e,Index jtI)

{
  Index IVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  undefined4 in_EDX;
  Index in_ESI;
  BayesianGameCollaborativeGraphical *in_RDI;
  Index jtGI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> restrictedIndivTypes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  BayesianGameCollaborativeGraphical *this_01;
  
  this_01 = in_RDI;
  pvVar2 = BayesianGameBase::JointToIndividualTypeIndices((BayesianGameBase *)in_RDI,in_ESI);
  this_00 = &local_30;
  RestrictIndividualIndicesToScope<unsigned_int>
            (this_01,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(in_ESI,in_EDX),
             (Index)((ulong)pvVar2 >> 0x20));
  std::vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>::
  operator[](&in_RDI->_m_LRFs,(ulong)in_ESI);
  IVar1 = BayesianGameBase::IndividualToJointTypeIndices
                    ((BayesianGameBase *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_00);
  return IVar1;
}

Assistant:

Index  BayesianGameCollaborativeGraphical::
JointToGroupTypeIndex(Index e, Index jtI) const
{
    const vector<Index> &indTypes = JointToIndividualTypeIndices(jtI);
    vector<Index> restrictedIndivTypes = RestrictIndividualIndicesToScope(
            indTypes, e);    
    Index jtGI = _m_LRFs[e]->
        IndividualToJointTypeIndices(restrictedIndivTypes);
    return(jtGI);
}